

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faces_kba.c
# Opt level: O2

void Faces_create(Faces *faces,Dimensions dims_b,int noctant_per_block,Bool_t is_face_comm_async,
                 Env *env)

{
  Bool_t BVar1;
  size_t sVar2;
  Pointer *pPVar3;
  int iVar4;
  uint uVar5;
  
  faces->noctant_per_block = noctant_per_block;
  faces->is_face_comm_async = is_face_comm_async;
  Faces_facexy(faces,noctant_per_block);
  sVar2 = Dimensions_size_facexy(dims_b,4,noctant_per_block);
  BVar1 = Env_cuda_is_using_device(env);
  Pointer_create(&faces->facexy0,sVar2,BVar1);
  Faces_facexy(faces,(int)sVar2);
  iVar4 = 1;
  Pointer_set_pinned(&faces->facexy0,1);
  Faces_facexy(faces,iVar4);
  Pointer_allocate(&faces->facexy0);
  for (uVar5 = 0; iVar4 = faces->is_face_comm_async, uVar5 < (uint)(iVar4 != 0) * 2 + 1;
      uVar5 = uVar5 + 1) {
    pPVar3 = Faces_facexz(faces,uVar5);
    sVar2 = Dimensions_size_facexz(dims_b,4,noctant_per_block);
    BVar1 = Env_cuda_is_using_device(env);
    Pointer_create(pPVar3,sVar2,BVar1);
    pPVar3 = Faces_facexz(faces,uVar5);
    Pointer_set_pinned(pPVar3,1);
    pPVar3 = Faces_faceyz(faces,uVar5);
    sVar2 = Dimensions_size_faceyz(dims_b,4,noctant_per_block);
    BVar1 = Env_cuda_is_using_device(env);
    Pointer_create(pPVar3,sVar2,BVar1);
    pPVar3 = Faces_faceyz(faces,uVar5);
    Pointer_set_pinned(pPVar3,1);
  }
  for (uVar5 = 0; uVar5 < (uint)(iVar4 != 0) * 2 + 1; uVar5 = uVar5 + 1) {
    pPVar3 = Faces_facexz(faces,uVar5);
    Pointer_allocate(pPVar3);
    pPVar3 = Faces_faceyz(faces,uVar5);
    Pointer_allocate(pPVar3);
    iVar4 = faces->is_face_comm_async;
  }
  return;
}

Assistant:

void Faces_create( Faces*      faces,
                   Dimensions  dims_b,
                   int         noctant_per_block,
                   Bool_t      is_face_comm_async,
                   Env*        env )
{
  int i = 0;

  faces->noctant_per_block  = noctant_per_block;
  faces->is_face_comm_async = is_face_comm_async;

  /*====================*/
  /*---Allocate faces---*/
  /*====================*/

  Pointer_create(       Faces_facexy( faces, 0 ),
    Dimensions_size_facexy( dims_b, NU, noctant_per_block ),
    Env_cuda_is_using_device( env ) );
  Pointer_set_pinned( Faces_facexy( faces, 0 ), Bool_true );
  Pointer_allocate(     Faces_facexy( faces, 0 ) );

  for( i = 0; i < ( Faces_is_face_comm_async( faces ) ? NDIM : 1 ); ++i )
  {
    Pointer_create(       Faces_facexz( faces, i ),
      Dimensions_size_facexz( dims_b, NU, noctant_per_block ),
      Env_cuda_is_using_device( env ) );
    Pointer_set_pinned( Faces_facexz( faces, i ), Bool_true );

    Pointer_create(       Faces_faceyz( faces, i ),
      Dimensions_size_faceyz( dims_b, NU, noctant_per_block ),
      Env_cuda_is_using_device( env ) );
    Pointer_set_pinned( Faces_faceyz( faces, i ), Bool_true );
  }

  for( i = 0; i < ( Faces_is_face_comm_async( faces ) ? NDIM : 1 ); ++i )
  {
    Pointer_allocate( Faces_facexz( faces, i ) );
    Pointer_allocate( Faces_faceyz( faces, i ) );
  }
}